

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveFromArena_Test::TestBody
          (MovableMessageTest_MoveFromArena_Test *this)

{
  bool bVar1;
  TestAllTypes *message;
  char *message_00;
  AssertHelper local_440;
  Message local_438;
  TestAllTypes_NestedMessage *local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar;
  TestAllTypes message2;
  TestAllTypes_NestedMessage *nested;
  TestAllTypes *message1_on_arena;
  Arena arena;
  MovableMessageTest_MoveFromArena_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message1_on_arena);
  message = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&message1_on_arena);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  message2.field_0._808_8_ = proto2_unittest::TestAllTypes::optional_nested_message(message);
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&gtest_ar.message_);
  proto2_unittest::TestAllTypes::operator=((TestAllTypes *)&gtest_ar.message_,message);
  local_430 = proto2_unittest::TestAllTypes::optional_nested_message
                        ((TestAllTypes *)&gtest_ar.message_);
  testing::internal::
  CmpHelperNE<proto2_unittest::TestAllTypes_NestedMessage_const*,proto2_unittest::TestAllTypes_NestedMessage_const*>
            ((internal *)local_428,"nested","&message2.optional_nested_message()",
             (TestAllTypes_NestedMessage **)((long)&message2.field_0 + 0x328),&local_430);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/move_unittest.cc"
               ,0x70,message_00);
    testing::internal::AssertHelper::operator=(&local_440,&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)&gtest_ar.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar.message_);
  Arena::~Arena((Arena *)&message1_on_arena);
  return;
}

Assistant:

TEST(MovableMessageTest, MoveFromArena) {
  Arena arena;

  auto* message1_on_arena =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena);
  TestUtil::SetAllFields(message1_on_arena);
  const auto* nested = &message1_on_arena->optional_nested_message();

  proto2_unittest::TestAllTypes message2;

  // Moving from a message on the arena should lead to a copy.
  message2 = std::move(*message1_on_arena);
  EXPECT_NE(nested, &message2.optional_nested_message());
  TestUtil::ExpectAllFieldsSet(*message1_on_arena);
  TestUtil::ExpectAllFieldsSet(message2);
}